

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_target * new_sqlite3_target(sqlite3 *db)

{
  sqlite3_target *target;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)alloc_mem(0x50);
  if (db_local == (sqlite3 *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    *(sqlite3 **)db_local = db;
    *(char **)(db_local + 8) =
         "INSERT INTO logs ( prival, version, timestamp, hostname, app_name, procid, msgid,  structured_data, message ) VALUES ( $prival, 1, $timestamp, $hostname, $app_name, $procid, $msgid, $structured_data, $message )"
    ;
    *(code **)(db_local + 0x10) = stumpless_sqlite3_prepare;
    *(sqlite3 **)(db_local + 0x18) = db_local;
    *(undefined8 *)(db_local + 0x20) = 0;
    pthread_init_mutex((pthread_mutex_t *)(db_local + 0x28));
  }
  return (sqlite3_target *)db_local;
}

Assistant:

struct sqlite3_target *
new_sqlite3_target( sqlite3 *db ) {
  struct sqlite3_target *target;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    return NULL;
  }

  target->db = db;
  target->insert_sql = STUMPLESS_DEFAULT_SQLITE3_INSERT_SQL;
  target->prepare_func = stumpless_sqlite3_prepare;
  target->prepare_data = target;
  target->insert_stmts[0] = NULL;
  config_init_mutex( &target->db_mutex );

  return target;
}